

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacency.cpp
# Opt level: O0

char * __thiscall
glcts::GeometryShaderAdjacency::getFragmentShaderCode(GeometryShaderAdjacency *this)

{
  GeometryShaderAdjacency *this_local;
  
  return getFragmentShaderCode::result;
}

Assistant:

const char* GeometryShaderAdjacency::getFragmentShaderCode()
{
	static const char* result = "${VERSION}\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"void main()\n"
								"{\n"
								"}\n";
	return result;
}